

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::
ArrayBuilder<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
::truncate(ArrayBuilder<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
           *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  pEVar1 = this->ptr;
  while (pEVar2 = this->pos, pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    Own<capnp::JsonCodec::AnnotatedHandler>::dispose(&pEVar2[-1].value.ptr);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }